

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_hsort(size_t element_len)

{
  uint32_t uVar1;
  uchar *in_RDI;
  int n;
  int i;
  test_hsort_cmp_data data;
  uchar elements [4225];
  undefined4 in_stack_ffffffffffffef50;
  undefined4 in_stack_ffffffffffffef54;
  uint32_t range;
  _func_int_void_ptr_void_ptr_void_ptr *cmp;
  size_t in_stack_ffffffffffffef68;
  uchar *in_stack_ffffffffffffef70;
  
  memset(&stack0xffffffffffffef68,0,0x1081);
  cmp = (_func_int_void_ptr_void_ptr_void_ptr *)0x0;
  secp256k1_hsort(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68,(size_t)in_RDI,
                  (_func_int_void_ptr_void_ptr_void_ptr *)0x0,
                  (void *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
  if (cmp != (_func_int_void_ptr_void_ptr_void_ptr *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xe19,"test condition failed: data.counter == 0");
    abort();
  }
  secp256k1_hsort(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68,(size_t)in_RDI,
                  (_func_int_void_ptr_void_ptr_void_ptr *)0x0,
                  (void *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
  if (cmp != (_func_int_void_ptr_void_ptr_void_ptr *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xe1b,"test condition failed: data.counter == 0");
    abort();
  }
  secp256k1_hsort(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68,(size_t)in_RDI,
                  (_func_int_void_ptr_void_ptr_void_ptr *)0x0,
                  (void *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
  if (cmp < (_func_int_void_ptr_void_ptr_void_ptr *)0x40) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xe1d,"test condition failed: data.counter >= NUM - 1");
    abort();
  }
  test_hsort_is_sorted
            (in_RDI,(size_t)cmp,CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
  for (range = 0; (int)range < COUNT; range = range + 1) {
    uVar1 = testrand_int(range);
    testrand_bytes_test(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
    secp256k1_hsort(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68,(size_t)in_RDI,cmp,
                    (void *)CONCAT44(range,uVar1));
    test_hsort_is_sorted(in_RDI,(size_t)cmp,CONCAT44(range,uVar1));
  }
  return;
}

Assistant:

static void test_hsort(size_t element_len) {
    unsigned char elements[NUM * MAX_ELEMENT_LEN] = { 0 };
    struct test_hsort_cmp_data data;
    int i;

    VERIFY_CHECK(element_len <= MAX_ELEMENT_LEN);
    data.counter = 0;
    data.element_len = element_len;

    secp256k1_hsort(elements, 0, element_len, test_hsort_cmp, &data);
    CHECK(data.counter == 0);
    secp256k1_hsort(elements, 1, element_len, test_hsort_cmp, &data);
    CHECK(data.counter == 0);
    secp256k1_hsort(elements, NUM, element_len, test_hsort_cmp, &data);
    CHECK(data.counter >= NUM - 1);
    test_hsort_is_sorted(elements, NUM, element_len);

    /* Test hsort with array of random length n */
    for (i = 0; i < COUNT; i++) {
        int n = testrand_int(NUM);
        testrand_bytes_test(elements, n*element_len);
        secp256k1_hsort(elements, n, element_len, test_hsort_cmp, &data);
        test_hsort_is_sorted(elements, n, element_len);
    }
}